

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.hpp
# Opt level: O1

void __thiscall
diy::detail::KDTreePartners::link_neighbors
          (KDTreePartners *this,int param_1,int gid,vector<int,_std::allocator<int>_> *partners,
          Master *m)

{
  _Rb_tree_header *p_Var1;
  Link *pLVar2;
  iterator __position;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  long lVar5;
  long lVar6;
  long lVar7;
  set<int,_std::less<int>,_std::allocator<int>_> result;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  iVar3 = Master::lid(m,gid);
  pLVar2 = (m->links_).super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
           super__Vector_impl_data._M_start[iVar3];
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar6 = *(long *)&(pLVar2->neighbors_).
                    super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl;
  p_Var4 = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (0 < (int)((ulong)((long)*(pointer *)
                               ((long)&(pLVar2->neighbors_).
                                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                               + 8) - lVar6) >> 3)) {
    lVar7 = 0;
    lVar5 = 0;
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,(int *)(lVar6 + lVar7));
      lVar5 = lVar5 + 1;
      lVar6 = *(long *)&(pLVar2->neighbors_).
                        super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl;
      lVar7 = lVar7 + 8;
      p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    } while (lVar5 < (int)((ulong)((long)*(pointer *)
                                          ((long)&(pLVar2->neighbors_).
                                                  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                          + 8) - lVar6) >> 3));
  }
  for (; (_Rb_tree_header *)p_Var4 != p_Var1;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    __position._M_current =
         (partners->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (partners->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)partners,__position,(int *)(p_Var4 + 1));
    }
    else {
      *__position._M_current = p_Var4[1]._M_color;
      (partners->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

inline void   link_neighbors(int, int gid, std::vector<int>& partners, const diy::Master& m) const
  {
    int         lid  = m.lid(gid);
    diy::Link*  link = m.link(lid);

    std::set<int> result;       // partners must be unique
    for (int i = 0; i < link->size(); ++i)
        result.insert(link->target(i).gid);

    for (std::set<int>::const_iterator it = result.begin(); it != result.end(); ++it)
        partners.push_back(*it);
  }